

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::stack_per
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_e [6];
  
  local_e[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_e);
    local_e[1] = 0;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_e + 1);
      local_e[2] = 3;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_e + 2);
        local_e[3] = 0x2b;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_e + 3);
          local_e[4] = 0x17;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_e + 4);
            local_e[5] = 0x17;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_e + 5);
              return;
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void stack_per(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// Offset low.
		target(CycleFetchIncrementPC);			// Offset high.
		target(CycleFetchPreviousPCThrowaway);	// IO.

		target(OperationConstructPER);

		target(CyclePushNotEmulation);			// AAH.
		target(CyclePushNotEmulation);			// AAL.
	}